

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_TestShell::
TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_TestShell
          (TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_TestShell *this)

{
  TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_CommandLineArguments_setExcludeStrictGroupFilterSameParameter_TestShell_003cb490;
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeStrictGroupFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-xsggroup" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.invertMatching();
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}